

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *
__thiscall
sf::String::toUtf32_abi_cxx11_
          (basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,String *this)

{
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(__return_storage_ptr__,&this->m_string);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Uint32> String::toUtf32() const
{
    return m_string;
}